

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::copyAttGroupAttributes
          (TraverseSchema *this,DOMElement *elem,XercesAttGroupInfo *fromAttGroup,
          XercesAttGroupInfo *toAttGroup,ComplexTypeInfo *typeInfo)

{
  bool bVar1;
  uint uVar2;
  ValidatorType VVar3;
  SchemaAttDef *pSVar4;
  SchemaAttDef *this_00;
  QName *this_01;
  XMLCh *name;
  DatatypeValidator *this_02;
  SchemaAttDef *pSVar5;
  SchemaAttDef *pSVar6;
  XMLSize_t XVar7;
  ulong local_88;
  XMLSize_t j;
  XMLSize_t anyAttCount;
  SchemaAttDef *clonedAttDef;
  DatatypeValidator *attDV;
  XMLCh *localPart;
  QName *attName;
  SchemaAttDef *attDef;
  XMLSize_t i;
  XMLSize_t attCount;
  ComplexTypeInfo *typeInfo_local;
  XercesAttGroupInfo *toAttGroup_local;
  XercesAttGroupInfo *fromAttGroup_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  pSVar4 = (SchemaAttDef *)XercesAttGroupInfo::attributeCount(fromAttGroup);
  attDef = (SchemaAttDef *)0x0;
  do {
    if (pSVar4 <= attDef) {
      if (toAttGroup != (XercesAttGroupInfo *)0x0) {
        XVar7 = XercesAttGroupInfo::anyAttributeCount(fromAttGroup);
        for (local_88 = 0; local_88 < XVar7; local_88 = local_88 + 1) {
          pSVar4 = XercesAttGroupInfo::anyAttributeAt(fromAttGroup,local_88);
          XercesAttGroupInfo::addAnyAttDef(toAttGroup,pSVar4,true);
        }
      }
      return;
    }
    this_00 = XercesAttGroupInfo::attributeAt(fromAttGroup,(XMLSize_t)attDef);
    this_01 = SchemaAttDef::getAttName(this_00);
    name = QName::getLocalPart(this_01);
    this_02 = SchemaAttDef::getDatatypeValidator(this_00);
    if (typeInfo == (ComplexTypeInfo *)0x0) {
      uVar2 = QName::getURI(this_01);
      bVar1 = XercesAttGroupInfo::containsAttribute(toAttGroup,name,uVar2);
      if (bVar1) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x31,name,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      else {
        if ((this_02 != (DatatypeValidator *)0x0) &&
           (VVar3 = DatatypeValidator::getType(this_02), VVar3 == ID)) {
          bVar1 = XercesAttGroupInfo::containsTypeWithId(toAttGroup);
          if (bVar1) {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8a,name,(XMLCh *)0x0,
                              (XMLCh *)0x0,(XMLCh *)0x0);
            goto LAB_0043fe81;
          }
          XercesAttGroupInfo::setTypeWithId(toAttGroup,true);
        }
        XercesAttGroupInfo::addAttDef(toAttGroup,this_00,true);
      }
    }
    else {
      uVar2 = QName::getURI(this_01);
      pSVar5 = ComplexTypeInfo::getAttDef(typeInfo,name,uVar2);
      if (pSVar5 == (SchemaAttDef *)0x0) {
        if ((this_02 != (DatatypeValidator *)0x0) &&
           (VVar3 = DatatypeValidator::getType(this_02), VVar3 == ID)) {
          bVar1 = ComplexTypeInfo::containsAttWithTypeId(typeInfo);
          if (bVar1) {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x89,name,(XMLCh *)0x0,
                              (XMLCh *)0x0,(XMLCh *)0x0);
            goto LAB_0043fe81;
          }
          ComplexTypeInfo::setAttWithTypeId(typeInfo,true);
        }
        pSVar5 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
        SchemaAttDef::SchemaAttDef(pSVar5,this_00);
        ComplexTypeInfo::addAttDef(typeInfo,pSVar5);
        pSVar6 = SchemaAttDef::getBaseAttDecl(pSVar5);
        if (pSVar6 == (SchemaAttDef *)0x0) {
          SchemaAttDef::setBaseAttDecl(pSVar5,this_00);
        }
        if (toAttGroup != (XercesAttGroupInfo *)0x0) {
          XercesAttGroupInfo::addAttDef(toAttGroup,this_00,true);
        }
      }
      else {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x31,name,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
LAB_0043fe81:
    attDef = (SchemaAttDef *)
             ((long)&(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable + 1);
  } while( true );
}

Assistant:

void TraverseSchema::copyAttGroupAttributes(const DOMElement* const elem,
                                            XercesAttGroupInfo* const fromAttGroup,
                                            XercesAttGroupInfo* const toAttGroup,
                                            ComplexTypeInfo* const typeInfo) {

    XMLSize_t attCount = fromAttGroup->attributeCount();

    for (XMLSize_t i=0; i < attCount; i++) {

        SchemaAttDef* attDef = fromAttGroup->attributeAt(i);
        QName* attName = attDef->getAttName();
        const XMLCh* localPart = attName->getLocalPart();
        DatatypeValidator* attDV = attDef->getDatatypeValidator();

        if (typeInfo) {

            if (typeInfo->getAttDef(localPart, attName->getURI())) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, localPart);
                continue;
            }

            if (attDV && attDV->getType() == DatatypeValidator::ID) {

                if (typeInfo->containsAttWithTypeId()) {

                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect5, localPart);
                    continue;
                }

                typeInfo->setAttWithTypeId(true);
            }

            SchemaAttDef* clonedAttDef = new (fGrammarPoolMemoryManager) SchemaAttDef(attDef);
            typeInfo->addAttDef(clonedAttDef);

            if (!clonedAttDef->getBaseAttDecl())
                clonedAttDef->setBaseAttDecl(attDef);

            if (toAttGroup) {
                toAttGroup->addAttDef(attDef, true);
            }
        }
        else {

            if (toAttGroup->containsAttribute(localPart, attName->getURI())) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, localPart);
                continue;
            }

            if (attDV && attDV->getType() == DatatypeValidator::ID) {

                if (toAttGroup->containsTypeWithId()) {

                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttGrpPropCorrect3, localPart);
                    continue;
                }

                toAttGroup->setTypeWithId(true);
            }

            toAttGroup->addAttDef(attDef, true);
        }
    }

    if (toAttGroup) {
        XMLSize_t anyAttCount = fromAttGroup->anyAttributeCount();

        for (XMLSize_t j=0; j < anyAttCount; j++) {
            toAttGroup->addAnyAttDef(fromAttGroup->anyAttributeAt(j), true);
        }
    }
}